

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O2

LinearSpace3fa * __thiscall
embree::avx2::LineSegmentsISA::computeAlignedSpaceMB
          (LinearSpace3fa *__return_storage_ptr__,LineSegmentsISA *this,size_t primID,
          BBox1f time_range)

{
  BBox1f BVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 in_register_00001208 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar14;
  float fVar15;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 local_28 [16];
  
  auVar5._8_56_ = in_register_00001208;
  auVar5._0_8_ = time_range;
  BVar1 = (this->super_LineSegments).super_Geometry.time_range;
  auVar6._8_8_ = 0;
  auVar6._0_4_ = BVar1.lower;
  auVar6._4_4_ = BVar1.upper;
  fVar16 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
  fVar14 = BVar1.lower;
  auVar6 = vmovshdup_avx(auVar6);
  fVar10 = auVar6._0_4_ - fVar14;
  auVar3 = vmovshdup_avx(auVar5._0_16_);
  auVar6 = ZEXT416((uint)(fVar16 * ((time_range.lower - fVar14) / fVar10) * 1.0000002));
  auVar6 = vroundss_avx(auVar6,auVar6,9);
  auVar6 = vmaxss_avx(ZEXT816(0),auVar6);
  auVar3 = ZEXT416((uint)(fVar16 * ((auVar3._0_4_ - fVar14) / fVar10) * 0.99999976));
  auVar3 = vroundss_avx(auVar3,auVar3,10);
  auVar3 = vminss_avx(auVar3,ZEXT416((uint)fVar16));
  if ((int)auVar3._0_4_ == (int)auVar6._0_4_) {
    auVar6 = vdpps_avx(_DAT_01f7b620,_DAT_01f7b620,0x7f);
    auVar11 = SUB6416(ZEXT464(0xbf800000),0);
    auVar3 = vdpps_avx(auVar11,auVar11,0x7f);
    auVar6 = vcmpps_avx(auVar3,auVar6,1);
    auVar7._0_4_ = auVar6._0_4_;
    auVar7._4_4_ = auVar7._0_4_;
    auVar7._8_4_ = auVar7._0_4_;
    auVar7._12_4_ = auVar7._0_4_;
    auVar6 = vblendvps_avx(auVar11,_DAT_01f7b620,auVar7);
    auVar3 = vdpps_avx(auVar6,auVar6,0x7f);
    auVar11 = vrsqrtss_avx(auVar3,auVar3);
    fVar16 = auVar11._0_4_;
    fVar16 = fVar16 * 1.5 - auVar3._0_4_ * 0.5 * fVar16 * fVar16 * fVar16;
    aVar8._0_4_ = auVar6._0_4_ * fVar16;
    aVar8._4_4_ = auVar6._4_4_ * fVar16;
    aVar8._8_4_ = auVar6._8_4_ * fVar16;
    aVar8._12_4_ = auVar6._12_4_ * fVar16;
    auVar12._0_4_ = aVar8._0_4_ * -0.0;
    auVar12._4_4_ = aVar8._4_4_ * -1.0;
    auVar12._8_4_ = aVar8._8_4_ * -0.0;
    auVar12._12_4_ = aVar8._12_4_ * -0.0;
    auVar6 = vshufps_avx((undefined1  [16])aVar8,(undefined1  [16])aVar8,0xc9);
    auVar6 = vfmadd231ps_fma(auVar12,(undefined1  [16])_DAT_01f46750,auVar6);
    auVar11 = vshufps_avx(auVar6,auVar6,0xc9);
    auVar6 = vdpps_avx(auVar11,auVar11,0x7f);
    auVar3 = vrsqrtss_avx(auVar6,auVar6);
    fVar16 = auVar3._0_4_;
    fVar16 = fVar16 * 1.5 - auVar6._0_4_ * 0.5 * fVar16 * fVar16 * fVar16;
    aVar4 = _DAT_01f46750;
  }
  else {
    (*(this->super_LineSegments).super_Geometry.super_RefCount._vptr_RefCount[0x38])
              (local_28,this,primID & 0xffffffff,(long)(((int)auVar6._0_4_ + (int)auVar3._0_4_) / 2)
              );
    auVar6 = vdpps_avx(local_28,local_28,0x7f);
    auVar3 = vrsqrtss_avx(auVar6,auVar6);
    fVar16 = auVar3._0_4_;
    fVar16 = fVar16 * 1.5 + auVar6._0_4_ * -0.5 * fVar16 * fVar16 * fVar16;
    aVar4._0_4_ = local_28._0_4_ * fVar16;
    aVar4._4_4_ = local_28._4_4_ * fVar16;
    aVar4._8_4_ = local_28._8_4_ * fVar16;
    aVar4._12_4_ = local_28._12_4_ * fVar16;
    auVar3._8_4_ = 0xff7fffff;
    auVar3._0_8_ = 0xff7fffffff7fffff;
    auVar3._12_4_ = 0xff7fffff;
    auVar6 = vcmpps_avx((undefined1  [16])aVar4,auVar3,5);
    auVar11._8_4_ = 0x7f7fffff;
    auVar11._0_8_ = 0x7f7fffff7f7fffff;
    auVar11._12_4_ = 0x7f7fffff;
    auVar3 = vcmpps_avx((undefined1  [16])aVar4,auVar11,2);
    auVar6 = vandps_avx(auVar6,auVar3);
    uVar2 = vmovmskps_avx(auVar6);
    if ((~(byte)uVar2 & 7) != 0) {
      fVar10 = 0.0;
      fVar14 = 1.0;
      fVar15 = 0.0;
      fVar16 = 0.0;
      aVar8 = SUB6416(ZEXT464(0x3f800000),0);
      aVar4 = _DAT_01f46750;
      goto LAB_0150064c;
    }
    auVar3 = vshufpd_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,1);
    auVar6 = vmovshdup_avx((undefined1  [16])aVar4);
    auVar17._8_4_ = 0x80000000;
    auVar17._0_8_ = 0x8000000080000000;
    auVar17._12_4_ = 0x80000000;
    auVar13._0_4_ = auVar6._0_4_ ^ 0x80000000;
    auVar6 = vunpckhps_avx((undefined1  [16])aVar4,ZEXT816(0) << 0x40);
    auVar13._4_12_ = ZEXT812(0) << 0x20;
    auVar13 = vshufps_avx(auVar6,auVar13,0x41);
    auVar9._0_8_ = auVar3._0_8_ ^ 0x8000000080000000;
    auVar9._8_8_ = auVar3._8_8_ ^ auVar17._8_8_;
    auVar11 = vinsertps_avx(auVar9,(undefined1  [16])aVar4,0x2a);
    auVar6 = vdpps_avx(auVar13,auVar13,0x7f);
    auVar3 = vdpps_avx(auVar11,auVar11,0x7f);
    auVar6 = vcmpps_avx(auVar3,auVar6,1);
    auVar18._0_4_ = auVar6._0_4_;
    auVar18._4_4_ = auVar18._0_4_;
    auVar18._8_4_ = auVar18._0_4_;
    auVar18._12_4_ = auVar18._0_4_;
    auVar6 = vblendvps_avx(auVar11,auVar13,auVar18);
    auVar3 = vdpps_avx(auVar6,auVar6,0x7f);
    auVar11 = vrsqrtss_avx(auVar3,auVar3);
    fVar16 = auVar11._0_4_;
    fVar16 = fVar16 * 1.5 - auVar3._0_4_ * 0.5 * fVar16 * fVar16 * fVar16;
    aVar8._0_4_ = auVar6._0_4_ * fVar16;
    aVar8._4_4_ = auVar6._4_4_ * fVar16;
    aVar8._8_4_ = auVar6._8_4_ * fVar16;
    aVar8._12_4_ = auVar6._12_4_ * fVar16;
    auVar6 = vshufps_avx((undefined1  [16])aVar8,(undefined1  [16])aVar8,0xc9);
    auVar3 = vshufps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0xc9);
    auVar19._0_4_ = aVar8._0_4_ * auVar3._0_4_;
    auVar19._4_4_ = aVar8._4_4_ * auVar3._4_4_;
    auVar19._8_4_ = aVar8._8_4_ * auVar3._8_4_;
    auVar19._12_4_ = aVar8._12_4_ * auVar3._12_4_;
    auVar6 = vfmsub231ps_fma(auVar19,(undefined1  [16])aVar4,auVar6);
    auVar11 = vshufps_avx(auVar6,auVar6,0xc9);
    auVar6 = vdpps_avx(auVar11,auVar11,0x7f);
    auVar3 = vrsqrtss_avx(auVar6,auVar6);
    fVar16 = auVar3._0_4_;
    fVar16 = fVar16 * 1.5 - auVar6._0_4_ * 0.5 * fVar16 * fVar16 * fVar16;
  }
  fVar10 = fVar16 * auVar11._0_4_;
  fVar14 = fVar16 * auVar11._4_4_;
  fVar15 = fVar16 * auVar11._8_4_;
  fVar16 = fVar16 * auVar11._12_4_;
LAB_0150064c:
  (__return_storage_ptr__->vx).field_0 = aVar8;
  (__return_storage_ptr__->vy).field_0.m128[0] = fVar10;
  (__return_storage_ptr__->vy).field_0.m128[1] = fVar14;
  (__return_storage_ptr__->vy).field_0.m128[2] = fVar15;
  (__return_storage_ptr__->vy).field_0.m128[3] = fVar16;
  (__return_storage_ptr__->vz).field_0 = aVar4;
  return __return_storage_ptr__;
}

Assistant:

LinearSpace3fa computeAlignedSpaceMB(const size_t primID, const BBox1f time_range) const
      {
        Vec3fa axisz(0,0,1);
        Vec3fa axisy(0,1,0);

        const range<int> tbounds = this->timeSegmentRange(time_range);
        if (tbounds.size() == 0) return frame(axisz);
        
        const size_t itime = (tbounds.begin()+tbounds.end())/2;

        const Vec3fa dir = normalize(computeDirection(primID,itime));
        if (is_finite(dir)) return frame(dir);
        else return LinearSpace3fa(one);
      }